

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O0

bool Assimp::Blender::read<Assimp::Blender::MVert>
               (Structure *s,MVert *p,size_t cnt,FileDatabase *db)

{
  undefined1 local_68 [8];
  MVert read;
  size_t i;
  FileDatabase *db_local;
  size_t cnt_local;
  MVert *p_local;
  Structure *s_local;
  
  read.bweight = 0;
  read._52_4_ = 0;
  cnt_local = (size_t)p;
  for (; (ulong)read._48_8_ < cnt; read._48_8_ = read._48_8_ + 1) {
    MVert::MVert((MVert *)local_68);
    Structure::Convert<Assimp::Blender::MVert>(s,(MVert *)local_68,db);
    MVert::operator=((MVert *)cnt_local,(MVert *)local_68);
    cnt_local = cnt_local + 0x38;
    MVert::~MVert((MVert *)local_68);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }